

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O1

void dynet::TensorTools::identity(Tensor *val)

{
  float *pfVar1;
  ulong uVar2;
  runtime_error *this;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  
  if (((val->d).nd == 2) && ((val->d).d[0] == (val->d).d[1])) {
    if (val->device->type == CPU) {
      uVar2 = (ulong)(val->d).d[0];
      if (uVar2 != 0) {
        pfVar1 = val->v;
        uVar3 = 0;
        lVar4 = 0;
        do {
          if ((val->d).d[1] != 0) {
            uVar5 = 0;
            do {
              fVar6 = 1.0;
              if (uVar3 != uVar5) {
                fVar6 = 0.0;
              }
              pfVar1[lVar4 + uVar5] = fVar6;
              uVar5 = uVar5 + 1;
            } while (uVar5 < (val->d).d[1]);
            lVar4 = lVar4 + uVar5;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar2);
      }
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Bad device type");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Attempt to set a tensor that is not a square matrix to identity");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TensorTools::identity(Tensor& val) {
  if (val.d.nd != 2 || val.d[0] != val.d[1])
    throw std::runtime_error("Attempt to set a tensor that is not a square matrix to identity");
  size_t pos = 0;
  if (val.device->type == DeviceType::CPU) {
    for (size_t i = 0; i < val.d[0]; ++i)
      for (size_t j = 0; j < val.d[1]; ++j)
        val.v[pos++] = (i == j ? 1 : 0);
#if HAVE_CUDA
  } else if (val.device->type == DeviceType::GPU) {
    float* t = new float[val.d.size()];
    for (size_t i = 0; i < val.d[0]; ++i)
      for (size_t j = 0; j < val.d[1]; ++j)
        t[pos++] = (i == j ? 1 : 0);
    CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
    delete[] t;
#endif
  } else { throw std::runtime_error("Bad device type"); }
}